

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_finish_popup(nk_context *ctx,nk_window *win)

{
  nk_popup_buffer *buf;
  nk_window *win_local;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x3ae4,"void nk_finish_popup(struct nk_context *, struct nk_window *)");
  }
  if (win == (nk_window *)0x0) {
    __assert_fail("win",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x3ae5,"void nk_finish_popup(struct nk_context *, struct nk_window *)");
  }
  if ((ctx != (nk_context *)0x0) && (win != (nk_window *)0x0)) {
    (win->popup).buf.last = (win->buffer).last;
    (win->popup).buf.end = (win->buffer).end;
  }
  return;
}

Assistant:

NK_LIB void
nk_finish_popup(struct nk_context *ctx, struct nk_window *win)
{
    struct nk_popup_buffer *buf;
    NK_ASSERT(ctx);
    NK_ASSERT(win);
    if (!ctx || !win) return;

    buf = &win->popup.buf;
    buf->last = win->buffer.last;
    buf->end = win->buffer.end;
}